

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O0

bool kratos::is_valid_verilog(string *src)

{
  undefined4 uVar1;
  ulong uVar2;
  char *pcVar3;
  runtime_error *prVar4;
  remove_reference_t<std::__cxx11::basic_string<char>_&> *in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  string_view format_str_00;
  format_args args;
  format_args args_00;
  string local_4f8;
  allocator<char> local_4d1;
  string local_4d0;
  undefined1 local_4b0 [8];
  string output_filename;
  string local_488;
  undefined1 local_468 [8];
  string iverilog;
  string local_440;
  allocator<char> local_419;
  string local_418;
  undefined1 local_3f8 [8];
  string verilator;
  undefined1 local_3d0 [4];
  int status;
  ofstream f;
  allocator<char> local_1b9;
  string local_1b8;
  undefined1 local_198 [8];
  string filename;
  string pathname;
  string *src_local;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_148;
  basic_string_view<char> local_138;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_128;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_100;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  char (*local_f0) [31];
  char *local_e8;
  string *local_e0;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_d8;
  basic_string_view<char> local_c8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_88;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_1;
  remove_reference_t<std::__cxx11::basic_string<char>_&> *local_78;
  char (*local_70) [15];
  char *local_68;
  string *local_60;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_58;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_50;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_48;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_40;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_38;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_10;
  
  fs::temp_directory_path_abi_cxx11_();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b8,"src.sv",&local_1b9);
  fs::join((string *)local_198,(string *)((long)&filename.field_2 + 8),&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::allocator<char>::~allocator(&local_1b9);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) != 0) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar4,"unable to create temp file");
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::ofstream::ofstream(local_3d0,(string *)local_198,_S_out);
  std::operator<<((ostream *)local_3d0,(string *)src);
  std::ofstream::close();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_418,"verilator",&local_419);
  fs::which((string *)local_3f8,&local_418);
  std::__cxx11::string::~string((string *)&local_418);
  std::allocator<char>::~allocator(&local_419);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    local_e0 = &local_440;
    local_e8 = "{0} {1} --lint-only -Wno-fatal";
    local_f0 = (char (*) [31])local_3f8;
    vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_198;
    fmt::v7::make_args_checked<std::__cxx11::string&,std::__cxx11::string&,char[31],char>
              (&local_128,(v7 *)"{0} {1} --lint-only -Wno-fatal",local_f0,
               (remove_reference_t<std::__cxx11::basic_string<char>_&> *)vargs,in_R8);
    local_100 = &local_128;
    local_138 = fmt::v7::to_string_view<char,_0>(local_e8);
    local_50 = &local_148;
    local_58 = local_100;
    local_48 = local_100;
    local_38 = local_100;
    local_40 = local_50;
    fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args(local_50,0xdd,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)local_100);
    format_str.size_ = local_148.desc_;
    format_str.data_ = (char *)local_138.size_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_148.field_1.values_;
    fmt::v7::detail::vformat_abi_cxx11_(&local_440,(detail *)local_138.data_,format_str,args);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    verilator.field_2._12_4_ = system(pcVar3);
    std::__cxx11::string::~string((string *)&local_440);
    fs::remove(local_198);
    iverilog.field_2._12_4_ = 1;
    uVar1 = verilator.field_2._12_4_;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_488,"iverilog",
               (allocator<char> *)(output_filename.field_2._M_local_buf + 0xf));
    fs::which((string *)local_468,&local_488);
    std::__cxx11::string::~string((string *)&local_488);
    std::allocator<char>::~allocator
              ((allocator<char> *)(output_filename.field_2._M_local_buf + 0xf));
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) != 0) {
      fs::remove(local_198);
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar4,"iverilog and verilator not found in the system");
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4d0,"out.a",&local_4d1);
    fs::join((string *)local_4b0,(string *)((long)&filename.field_2 + 8),&local_4d0);
    std::__cxx11::string::~string((string *)&local_4d0);
    std::allocator<char>::~allocator(&local_4d1);
    local_60 = &local_4f8;
    local_68 = "{0} {1} -o {2}";
    local_70 = (char (*) [15])local_468;
    local_78 = (remove_reference_t<std::__cxx11::basic_string<char>_&> *)local_198;
    vargs_1 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_4b0;
    fmt::v7::
    make_args_checked<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,char[15],char>
              (&local_b8,(v7 *)"{0} {1} -o {2}",local_70,local_78,
               (remove_reference_t<std::__cxx11::basic_string<char>_&> *)vargs_1,
               (remove_reference_t<std::__cxx11::basic_string<char>_&> *)in_R9.values_);
    local_88 = &local_b8;
    local_c8 = fmt::v7::to_string_view<char,_0>(local_68);
    local_28 = &local_d8;
    local_30 = local_88;
    local_20 = local_88;
    local_10 = local_88;
    local_18 = local_28;
    fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args(local_28,0xddd,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)local_88);
    format_str_00.size_ = local_d8.desc_;
    format_str_00.data_ = (char *)local_c8.size_;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_d8.field_1.values_;
    fmt::v7::detail::vformat_abi_cxx11_(&local_4f8,(detail *)local_c8.data_,format_str_00,args_00);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    verilator.field_2._12_4_ = system(pcVar3);
    std::__cxx11::string::~string((string *)&local_4f8);
    fs::remove(local_198);
    uVar1 = verilator.field_2._12_4_;
    iverilog.field_2._12_4_ = 1;
    std::__cxx11::string::~string((string *)local_4b0);
    std::__cxx11::string::~string((string *)local_468);
  }
  src_local._7_1_ = uVar1 == 0;
  std::__cxx11::string::~string((string *)local_3f8);
  std::ofstream::~ofstream(local_3d0);
  std::__cxx11::string::~string((string *)local_198);
  std::__cxx11::string::~string((string *)(filename.field_2._M_local_buf + 8));
  return src_local._7_1_;
}

Assistant:

bool is_valid_verilog(const std::string &src) {
    // we first output to a temp src
    std::string pathname = fs::temp_directory_path();
    std::string filename = fs::join(pathname, "src.sv");
    if (filename.empty()) throw std::runtime_error("unable to create temp file");
    std::ofstream f(filename);
    f << src;
    f.close();

    int status;

    // choose which parser to use
    // we use verilator first
    std::string verilator = fs::which("verilator");
    if (!verilator.empty()) {
        status =
            std::system(::format("{0} {1} --lint-only -Wno-fatal", verilator, filename).c_str());
        fs::remove(filename);
        return status == 0;
    }

    std::string iverilog = fs::which("iverilog");
    if (!iverilog.empty()) {
        std::string output_filename = fs::join(pathname, "out.a");
        status =
            std::system(::format("{0} {1} -o {2}", iverilog, filename, output_filename).c_str());
        fs::remove(filename);
        return status == 0;
    }

    fs::remove(filename);
    throw std::runtime_error("iverilog and verilator not found in the system");
}